

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

void yyCommit(GREG *G)

{
  int iVar1;
  GREG *G_local;
  
  iVar1 = G->limit - G->pos;
  G->limit = iVar1;
  if (iVar1 != 0) {
    memmove(G->buf,G->buf + G->pos,(long)G->limit);
  }
  G->offset = G->pos + G->offset;
  G->begin = G->begin - G->pos;
  G->end = G->end - G->pos;
  G->thunkpos = 0;
  G->pos = 0;
  return;
}

Assistant:

YY_LOCAL(void) yyCommit(GREG *G)
{
  if ((G->limit -= G->pos))
    {
      memmove(G->buf, G->buf + G->pos, G->limit);
    }
  G->offset += G->pos;
  G->begin -= G->pos;
  G->end -= G->pos;
  G->pos= G->thunkpos= 0;
}